

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void render_memory_region
               (FlatView *view,MemoryRegion_conflict *mr,Int128 base,AddrRange clip,_Bool readonly)

{
  MemoryRegion *mr_00;
  AddrRange r1;
  AddrRange r1_00;
  AddrRange clip_00;
  AddrRange r2;
  AddrRange r2_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  _Bool _Var7;
  FlatRange *pFVar8;
  uint uVar9;
  long in_RCX;
  ulong uVar10;
  ulong uVar11;
  undefined7 in_register_00000011;
  ulong uVar12;
  long lVar13;
  long lVar14;
  undefined4 uVar15;
  undefined8 in_R8;
  long lVar16;
  ulong uVar17;
  hwaddr hVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  bool bVar23;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 in_stack_ffffffffffffff68;
  FlatView *pFVar27;
  FlatRange local_78;
  
  lVar14 = clip.start._8_8_;
  uVar25 = base._8_8_;
  if (mr->enabled == true) {
    uVar11 = mr->addr;
    uVar20 = CONCAT71(in_register_00000011,readonly) + mr->addr;
    uVar15 = (undefined4)CONCAT71((int7)((ulong)in_R8 >> 8),(byte)in_R8 | mr->readonly);
    r1_00.size._0_8_ = in_stack_ffffffffffffff48;
    r1_00.start = clip.start;
    r1_00.size._8_4_ = uVar15;
    r1_00.size._12_4_ = in_stack_ffffffffffffff54;
    r2_00.start._8_8_ = (ulong)base;
    r2_00.start._0_8_ = mr;
    r2_00.size._0_8_ = in_stack_ffffffffffffff68;
    r2_00.size._8_8_ = (ulong)clip.start;
    uVar26 = (ulong)base;
    uVar10 = (ulong)clip.start;
    _Var7 = addrrange_intersects(r1_00,r2_00);
    if (_Var7) {
      r1.start._8_8_ = uVar25;
      r1.start._0_8_ = uVar26;
      r1.size._0_8_ = uVar10;
      r1.size._8_8_ = lVar14;
      r2.start._8_4_ = uVar15;
      r2.start._0_8_ = in_stack_ffffffffffffff48;
      r2.start._12_4_ = in_stack_ffffffffffffff54;
      r2.size._0_8_ = (MemoryRegion *)mr;
      r2.size._8_8_ = uVar26;
      addrrange_intersection((AddrRange *)&base,r1,r2);
      uVar10 = (ulong)clip.start;
      lVar14 = clip.start._8_8_;
      for (mr_00 = (((MemoryRegion *)mr)->subregions).tqh_first; clip.start._0_8_ = uVar10,
          clip.start._8_8_ = lVar14, mr_00 != (MemoryRegion *)0x0;
          mr_00 = (mr_00->subregions_link).tqe_next) {
        clip_00.start._8_8_ = lVar14;
        clip_00.start._0_8_ = uVar10;
        clip_00.size._0_8_ = in_stack_ffffffffffffff48;
        clip_00.size._8_4_ = uVar15;
        clip_00.size._12_4_ = in_stack_ffffffffffffff54;
        render_memory_region(view,(MemoryRegion_conflict *)mr_00,base,clip_00,SUB81(uVar20,0));
        uVar10 = (ulong)clip.start;
        lVar14 = clip.start._8_8_;
      }
      if (((MemoryRegion *)mr)->terminates == true) {
        hVar18 = (ulong)base - uVar20;
        if (base._8_8_ - (ulong)((ulong)base < uVar20) !=
            in_RCX + (ulong)CARRY8(CONCAT71(in_register_00000011,readonly),uVar11)) {
LAB_00cedd65:
          __assert_fail("r == a",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/int128.h"
                        ,0x16,"uint64_t int128_get64(Int128)");
        }
        local_78.readonly = SUB41(uVar15,0);
        uVar9 = view->nr;
        uVar21 = 0;
        local_78.mr = (MemoryRegion *)mr;
        auVar1 = (undefined1  [16])base;
        if ((uVar10 != 0 || lVar14 != 0) && uVar9 != 0) {
          pFVar8 = view->ranges;
          uVar25 = 0;
          uVar11 = 0;
          pFVar27 = view;
          do {
            lVar19 = auVar1._8_8_;
            uVar12 = auVar1._0_8_;
            uVar21 = (uint)uVar11;
            uVar20 = (ulong)pFVar8[uVar11].addr.start;
            lVar22 = *(long *)((long)&pFVar8[uVar11].addr.start + 8);
            uVar17 = (ulong)pFVar8[uVar11].addr.size;
            lVar13 = *(long *)((long)&pFVar8[uVar11].addr.size + 8) + lVar22 +
                     (ulong)CARRY8(uVar17,uVar20);
            uVar17 = (ulong)(uVar12 < uVar17 + uVar20);
            lVar16 = lVar19 - lVar13;
            if ((SBORROW8(lVar19,lVar13) != SBORROW8(lVar16,uVar17)) != (long)(lVar16 - uVar17) < 0)
            {
              if ((SBORROW8(lVar19,lVar22) != SBORROW8(lVar19 - lVar22,(ulong)(uVar12 < uVar20))) !=
                  (long)((lVar19 - lVar22) - (ulong)(uVar12 < uVar20)) < 0) {
                lVar22 = (lVar22 - lVar19) - (ulong)(uVar20 < uVar12);
                uVar11 = (ulong)(uVar10 < uVar20 - uVar12);
                uVar20 = uVar20 - uVar12;
                if ((SBORROW8(lVar14,lVar22) != SBORROW8(lVar14 - lVar22,uVar11)) !=
                    (long)((lVar14 - lVar22) - uVar11) < 0) {
                  lVar22 = lVar14;
                  uVar20 = uVar10;
                }
                auVar6._8_8_ = 0;
                auVar6._0_8_ = uVar20;
                uVar15 = (undefined4)uVar10;
                uVar24 = (undefined4)(uVar10 >> 0x20);
                local_78.offset_in_region = hVar18;
                local_78.addr.size._0_8_ = uVar20;
                local_78.addr.size._8_8_ = lVar22;
                local_78.addr.start = (Int128)auVar1;
                flatview_insert(view,uVar21,&local_78);
                view = pFVar27;
                if (lVar22 != 0) goto LAB_00cedd65;
                auVar1 = auVar1 + auVar6;
                uVar11 = (ulong)(uVar21 + 1);
                hVar18 = hVar18 + uVar20;
                uVar10 = CONCAT44(uVar24,uVar15) - uVar20;
                lVar14 = lVar14 - (ulong)(CONCAT44(uVar24,uVar15) < uVar20);
                pFVar8 = view->ranges;
                pFVar27 = view;
              }
              auVar2._8_8_ = lVar14;
              auVar2._0_8_ = uVar10;
              auVar4._8_8_ = uVar25;
              auVar4._0_8_ = auVar1._0_8_;
              uVar21 = (uint)uVar11;
              auVar2 = auVar1 + auVar2;
              uVar20 = (ulong)pFVar8[uVar11].addr.size;
              uVar17 = uVar20 + (long)pFVar8[uVar11].addr.start;
              lVar16 = *(long *)((long)&pFVar8[uVar11].addr.size + 8) +
                       *(long *)((long)&pFVar8[uVar11].addr.start + 8) +
                       (ulong)CARRY8(uVar20,(ulong)pFVar8[uVar11].addr.start);
              auVar3._8_8_ = lVar16;
              auVar3._0_8_ = uVar17;
              uVar11 = (ulong)(auVar2._0_8_ < uVar17);
              lVar22 = auVar2._8_8_ - lVar16;
              if ((SBORROW8(auVar2._8_8_,lVar16) != SBORROW8(lVar22,uVar11)) ==
                  (long)(lVar22 - uVar11) < 0) {
                auVar2 = auVar3;
              }
              uVar11 = SUB168(auVar2 - auVar4,0);
              auVar5._8_8_ = 0;
              auVar5._0_8_ = uVar11;
              if (auVar1._8_8_ != SUB168(auVar2 - auVar4,8)) goto LAB_00cedd65;
              auVar1 = auVar1 + auVar5;
              hVar18 = hVar18 + uVar11;
              bVar23 = uVar10 < uVar11;
              uVar10 = uVar10 - uVar11;
              lVar14 = lVar14 - (ulong)bVar23;
              uVar9 = view->nr;
            }
            uVar21 = uVar21 + 1;
            uVar11 = (ulong)uVar21;
          } while ((uVar21 < uVar9) && (uVar10 != 0 || lVar14 != 0));
        }
        if (uVar10 != 0 || lVar14 != 0) {
          local_78.offset_in_region = hVar18;
          local_78.addr.size._0_8_ = uVar10;
          local_78.addr.size._8_8_ = lVar14;
          local_78.addr.start = (Int128)auVar1;
          flatview_insert(view,uVar21,&local_78);
        }
      }
    }
  }
  return;
}

Assistant:

static void render_memory_region(FlatView *view,
                                 MemoryRegion *mr,
                                 Int128 base,
                                 AddrRange clip,
                                 bool readonly)
{
    MemoryRegion *subregion;
    unsigned i;
    hwaddr offset_in_region;
    Int128 remain;
    Int128 now;
    FlatRange fr;
    AddrRange tmp;

    if (!mr->enabled) {
        return;
    }

    int128_addto(&base, int128_make64(mr->addr));
    readonly |= mr->readonly;

    tmp = addrrange_make(base, mr->size);

    if (!addrrange_intersects(tmp, clip)) {
        return;
    }

    clip = addrrange_intersection(tmp, clip);

    /* Render subregions in priority order. */
    QTAILQ_FOREACH(subregion, &mr->subregions, subregions_link) {
        render_memory_region(view, subregion, base, clip, readonly);
    }

    if (!mr->terminates) {
        return;
    }

    offset_in_region = int128_get64(int128_sub(clip.start, base));
    base = clip.start;
    remain = clip.size;

    fr.mr = mr;
    fr.readonly = readonly;

    /* Render the region itself into any gaps left by the current view. */
    for (i = 0; i < view->nr && int128_nz(remain); ++i) {
        if (int128_ge(base, addrrange_end(view->ranges[i].addr))) {
            continue;
        }
        if (int128_lt(base, view->ranges[i].addr.start)) {
            now = int128_min(remain,
                             int128_sub(view->ranges[i].addr.start, base));
            fr.offset_in_region = offset_in_region;
            fr.addr = addrrange_make(base, now);
            flatview_insert(view, i, &fr);
            ++i;
            int128_addto(&base, now);
            offset_in_region += int128_get64(now);
            int128_subfrom(&remain, now);
        }
        now = int128_sub(int128_min(int128_add(base, remain),
                                    addrrange_end(view->ranges[i].addr)),
                         base);
        int128_addto(&base, now);
        offset_in_region += int128_get64(now);
        int128_subfrom(&remain, now);
    }
    if (int128_nz(remain)) {
        fr.offset_in_region = offset_in_region;
        fr.addr = addrrange_make(base, remain);
        flatview_insert(view, i, &fr);
    }
}